

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

ProxyNegotiator * proxy_http_new(ProxyNegotiatorVT *vt)

{
  void *__s;
  strbuf *psVar1;
  HttpAuthDetails *pHVar2;
  
  __s = safemalloc(1,0xe8,0);
  memset(__s,0,0xe8);
  *(ProxyNegotiatorVT **)((long)__s + 0x90) = vt;
  psVar1 = strbuf_new();
  *(strbuf **)((long)__s + 8) = psVar1;
  psVar1 = strbuf_new();
  *(strbuf **)((long)__s + 0x10) = psVar1;
  psVar1 = strbuf_new();
  *(strbuf **)((long)__s + 0x18) = psVar1;
  psVar1 = strbuf_new();
  *(strbuf **)((long)__s + 0x30) = psVar1;
  psVar1 = strbuf_new_nm();
  *(strbuf **)((long)__s + 0x38) = psVar1;
  psVar1 = strbuf_new();
  *(strbuf **)((long)__s + 0x58) = psVar1;
  *(undefined4 *)((long)__s + 0x60) = 0;
  pHVar2 = http_auth_details_new();
  *(HttpAuthDetails **)((long)__s + 0x48) = pHVar2;
  pHVar2->auth_type = AUTH_NONE;
  return (ProxyNegotiator *)((long)__s + 0x90);
}

Assistant:

static ProxyNegotiator *proxy_http_new(const ProxyNegotiatorVT *vt)
{
    HttpProxyNegotiator *s = snew(HttpProxyNegotiator);
    memset(s, 0, sizeof(*s));
    s->pn.vt = vt;
    s->response = strbuf_new();
    s->header = strbuf_new();
    s->token = strbuf_new();
    s->username = strbuf_new();
    s->password = strbuf_new_nm();
    s->uri = strbuf_new();
    s->nonce_count = 0;
    /*
     * Always start with a CONNECT request containing no auth. If the
     * proxy rejects that, it will tell us what kind of auth it would
     * prefer.
     */
    s->next_auth = http_auth_details_new();
    s->next_auth->auth_type = AUTH_NONE;
    return &s->pn;
}